

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall
ethash_params_init_genesis_calcifide_check::test_method
          (ethash_params_init_genesis_calcifide_check *this)

{
  uint64_t uVar1;
  uint32_t expected_cache_size;
  uint64_t cache_size;
  uint64_t full_size;
  undefined4 local_184;
  uint64_t local_180;
  undefined1 local_178 [8];
  undefined8 local_170;
  shared_count sStack_168;
  uint64_t local_160;
  uint64_t local_158;
  undefined **local_150;
  undefined1 local_148;
  undefined8 *local_140;
  char *local_138;
  undefined **local_130;
  undefined1 local_128;
  undefined ***local_120;
  undefined4 *local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined ***local_100;
  char *local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined ***local_e0;
  char *local_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined ***local_c0;
  uint64_t *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined ***local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  uVar1 = ethash_get_datasize(0);
  local_158 = uVar1;
  local_180 = ethash_get_cachesize(0);
  local_184 = 0xfffec0;
  local_40 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = local_180;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xb0);
  local_178[0] = uVar1 == 0x3ffff880;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_120 = &local_150;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_0013d750;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "\nexpected: ";
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013d790;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_0013d7d0;
  local_f8 = "\n";
  local_e8 = 0;
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_0013df50;
  local_b8 = &local_158;
  local_68 = 0;
  local_f0 = &PTR__lazy_ostream_0013d810;
  local_d8 = "actual: ";
  local_70 = &PTR__lazy_ostream_0013df90;
  local_58 = "\n";
  local_80 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_78 = "";
  local_118 = &local_184;
  local_100 = &local_130;
  local_e0 = &local_110;
  local_c0 = &local_f0;
  local_60 = &local_d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0xb3);
  local_178[0] = local_180 == 0xfffec0;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_0013d750;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "\nexpected: ";
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013d790;
  local_120 = &local_150;
  local_118 = &local_184;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_0013d7d0;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_0013d810;
  local_d8 = "actual: ";
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_0013df50;
  local_b8 = &local_160;
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_0013df90;
  local_f8 = "\n";
  local_58 = "\n";
  local_b0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_a8 = "";
  local_100 = &local_130;
  local_e0 = &local_110;
  local_c0 = &local_f0;
  local_60 = &local_d0;
  boost::test_tools::tt_detail::report_assertion(local_178,&local_70,&local_b0,0xb3,2,1,0);
  boost::detail::shared_count::~shared_count(&sStack_168);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ethash_params_init_genesis_calcifide_check) {
	uint64_t full_size = ethash_get_datasize(0);
	uint64_t cache_size = ethash_get_cachesize(0);
	const uint32_t expected_full_size = 1073739904;
	const uint32_t expected_cache_size = 16776896;
	BOOST_REQUIRE_MESSAGE(full_size == expected_full_size,
			"\nexpected: " << expected_cache_size << "\n"
					<< "actual: " << full_size << "\n");
	BOOST_REQUIRE_MESSAGE(cache_size == expected_cache_size,
			"\nexpected: " << expected_cache_size << "\n"
					<< "actual: " << cache_size << "\n");
}